

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

double __thiscall pugi::xpath_query::evaluate_number(xpath_query *this,xpath_node *n)

{
  bad_alloc *this_00;
  double r;
  xpath_stack_data sd;
  xpath_context c;
  xpath_node *n_local;
  xpath_query *this_local;
  
  if (this->_impl == (void *)0x0) {
    this_local = (xpath_query *)impl::anon_unknown_0::gen_nan();
  }
  else {
    impl::anon_unknown_0::xpath_context::xpath_context((xpath_context *)&sd.oom,n,1,1);
    impl::anon_unknown_0::xpath_stack_data::xpath_stack_data((xpath_stack_data *)&r);
    this_local = (xpath_query *)
                 impl::anon_unknown_0::xpath_ast_node::eval_number
                           (*this->_impl,(xpath_context *)&sd.oom,(xpath_stack *)&sd.temp._error);
    if (((byte)sd.stack.temp & 1) != 0) {
      this_00 = (bad_alloc *)__cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(this_00);
      __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data((xpath_stack_data *)&r);
  }
  return (double)this_local;
}

Assistant:

PUGI__FN double xpath_query::evaluate_number(const xpath_node& n) const
	{
		if (!_impl) return impl::gen_nan();

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		double r = static_cast<impl::xpath_query_impl*>(_impl)->root->eval_number(c, sd.stack);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return impl::gen_nan();
		#else
			throw std::bad_alloc();
		#endif
		}

		return r;
	}